

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool __thiscall
wasm::String::anon_unknown_0::doConvertWTF16ToWTF8
          (anon_unknown_0 *this,ostream *os,string_view str,bool allowWTF)

{
  ostream *os_00;
  bool bVar1;
  size_type sVar2;
  uint *puVar3;
  _Optional_payload_base<unsigned_int> local_34;
  _Optional_payload_base<unsigned_int> local_2c;
  optional<unsigned_int> u;
  bool valid;
  bool allowWTF_local;
  ostream *os_local;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ = (byte)str._M_str & 1;
  u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ = 1;
  unique0x100000b9 = this;
  os_local = os;
  while( true ) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&os_local);
    if (sVar2 == 0) break;
    local_2c = (_Optional_payload_base<unsigned_int>)
               takeWTF16CodePoint((string_view *)&os_local,
                                  (bool)(u.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                         .super__Optional_payload_base<unsigned_int>._M_payload.
                                         _M_value._3_1_ & 1));
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_2c);
    if (!bVar1) {
      u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ = 0;
      std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>
                ((optional<unsigned_int> *)&local_34,
                 &String::(anonymous_namespace)::replacementCharacter);
      local_2c = local_34;
    }
    os_00 = (ostream *)stack0xffffffffffffffe0;
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2c);
    writeWTF8CodePoint(os_00,*puVar3);
  }
  return (bool)(u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ & 1);
}

Assistant:

bool doConvertWTF16ToWTF8(std::ostream& os,
                          std::string_view str,
                          bool allowWTF) {
  bool valid = true;

  while (str.size()) {
    auto u = takeWTF16CodePoint(str, allowWTF);
    if (!u) {
      valid = false;
      u = replacementCharacter;
    }
    writeWTF8CodePoint(os, *u);
  }

  return valid;
}